

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directory.cpp
# Opt level: O2

int __thiscall Directory::mkdir(Directory *this,char *__path,__mode_t __mode)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  undefined7 extraout_var;
  string fullPath;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::operator+(&local_40,&this->path,"/");
  std::operator+(&fullPath,&local_40,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__path);
  std::__cxx11::string::~string((string *)&local_40);
  iVar2 = ::mkdir(fullPath._M_dataplus._M_p,__mode & 0x1ff ^ 0x41ff);
  if (iVar2 == 0) {
    bVar1 = refresh(this);
    iVar2 = (int)CONCAT71(extraout_var,bVar1);
  }
  else {
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    iVar2 = 0;
    softHSMLog(3,"mkdir",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/Directory.cpp"
               ,0xee,"Failed to create the directory (%s): %s",pcVar4,fullPath._M_dataplus._M_p);
  }
  std::__cxx11::string::~string((string *)&fullPath);
  return iVar2;
}

Assistant:

bool Directory::mkdir(std::string name, int umask)
{
	std::string fullPath = path + OS_PATHSEP + name;

#ifndef _WIN32
	int rv = ::mkdir(fullPath.c_str(), S_IFDIR | ((S_IRWXU | S_IRWXG | S_IRWXO) & ~umask));
#else
	(void)umask;
	int rv = _mkdir(fullPath.c_str());
#endif

	if (rv != 0)
	{
		ERROR_MSG("Failed to create the directory (%s): %s", strerror(errno), fullPath.c_str());

		return false;
	}

	return refresh();
}